

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O3

void __thiscall SSD1306::OledI2C::xorPixel(OledI2C *this)

{
  OledPoint in_RSI;
  
  xorPixel((OledI2C *)(this[-1].blocks_._M_elems[0x1f].bytes_._M_elems + 0x1a),in_RSI);
  return;
}

Assistant:

void
SSD1306::OledI2C::xorPixel(
    SSD1306::OledPoint p)
{
    if (not pixelInside(p))
    {
        return;
    }

    PixelOffset po{p};

    if ((blocks_[po.block].bytes_[po.byte] & (1 << po.bit)) == 0)
    {
        blocks_[po.block].bytes_[po.byte] |= (1 << po.bit);
    }
    else
    {
        blocks_[po.block].bytes_[po.byte] &= ~(1 << po.bit);
    }

    if (not blocks_[po.block].dirty_)
    {
        blocks_[po.block].dirty_ = true;
    }
}